

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

void spell_ventriloquate(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  CHAR_DATA *ch_00;
  bool bVar1;
  int iVar2;
  string *psVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  CHAR_DATA **ppCVar4;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  string buffer1;
  string buffer2;
  char *local_1258 [2];
  char *local_1248;
  char speaker [4608];
  
  target_name = one_argument(target_name,speaker);
  fmt.size_ = 0xcc;
  fmt.data_ = (char *)0xf;
  args.field_1.values_ = in_R9.values_;
  args.desc_ = (unsigned_long_long)local_1258;
  local_1258[0] = speaker;
  local_1248 = target_name;
  ::fmt::v9::vformat_abi_cxx11_(&buffer1,(v9 *)"{} says \'{}\'.\n\r",fmt,args);
  local_1248 = target_name;
  fmt_00.size_ = 0xcc;
  fmt_00.data_ = (char *)0x1c;
  args_00.field_1.values_ = in_R9.values_;
  args_00.desc_ = (unsigned_long_long)local_1258;
  local_1258[0] = speaker;
  ::fmt::v9::vformat_abi_cxx11_(&buffer2,(v9 *)"Someone makes {} say \'{}\'.\n\r",fmt_00,args_00);
  iVar2 = toupper((int)*buffer1._M_dataplus._M_p);
  *buffer1._M_dataplus._M_p = (char)iVar2;
  ppCVar4 = &ch->in_room->people;
  while (ch_00 = *ppCVar4, ch_00 != (CHAR_DATA *)0x0) {
    bVar1 = is_exact_name(speaker,ch_00->name);
    if (!bVar1) {
      bVar1 = is_awake(ch_00);
      if (bVar1) {
        bVar1 = saves_spell(level,ch_00,0x10);
        psVar3 = &buffer1;
        if (bVar1) {
          psVar3 = &buffer2;
        }
        send_to_char((psVar3->_M_dataplus)._M_p,ch_00);
      }
    }
    ppCVar4 = &ch_00->next_in_room;
  }
  std::__cxx11::string::~string((string *)&buffer2);
  std::__cxx11::string::~string((string *)&buffer1);
  return;
}

Assistant:

void spell_ventriloquate(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	char speaker[MAX_INPUT_LENGTH];
	CHAR_DATA *vch;

	target_name = one_argument(target_name, speaker);

	auto buffer1 = fmt::format("{} says '{}'.\n\r", speaker, target_name);
	auto buffer2 = fmt::format("Someone makes {} say '{}'.\n\r", speaker, target_name);
	buffer1[0] = toupper(buffer1[0]);

	for (vch = ch->in_room->people; vch != nullptr; vch = vch->next_in_room)
	{
		if (!is_exact_name(speaker, vch->name) && is_awake(vch))
			send_to_char(saves_spell(level, vch, DAM_OTHER) ? buffer2.c_str() : buffer1.c_str(), vch);
	}
}